

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.h
# Opt level: O0

void __thiscall cfd::core::ConfidentialTxOut::~ConfidentialTxOut(ConfidentialTxOut *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = std::__cxx11::string::substr;
  ByteData::~ByteData((ByteData *)0x3df34d);
  ByteData::~ByteData((ByteData *)0x3df35e);
  ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)0x3df36f);
  ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x3df37d);
  ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x3df38b);
  AbstractTxOut::~AbstractTxOut((AbstractTxOut *)0x3df395);
  return;
}

Assistant:

virtual ~ConfidentialTxOut() {
    // do nothing
  }